

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_rar5.c
# Opt level: O3

wchar_t rar5_read_data(archive_read *a,void **buff,size_t *size,int64_t *offset)

{
  int64_t *piVar1;
  wchar_t *pwVar2;
  undefined1 *puVar3;
  uint8_t *puVar4;
  byte bVar5;
  char cVar6;
  compressed_block_header cVar7;
  ushort uVar8;
  ushort uVar9;
  uint16_t uVar10;
  ushort uVar11;
  rar5 *rar;
  void *pvVar12;
  rar5 *rar_00;
  decode_table *pdVar13;
  bool bVar14;
  byte bVar15;
  wchar_t wVar16;
  int iVar17;
  wchar_t wVar18;
  int iVar19;
  size_t sVar20;
  uint8_t *puVar21;
  compressed_block_header *pcVar22;
  void *pvVar23;
  uint8_t *puVar24;
  uint *puVar25;
  int64_t iVar26;
  rar5 *prVar27;
  long lVar28;
  long lVar29;
  uint uVar30;
  uint uVar31;
  char *pcVar32;
  size_t sVar33;
  decode_table *pdVar34;
  decode_table *pdVar35;
  ulong uVar36;
  uint uVar37;
  uint8_t uVar38;
  short sVar39;
  ulong uVar40;
  uint8_t *puVar41;
  ulong uVar42;
  long lVar43;
  undefined8 *__dest;
  long lVar44;
  rar5 *prVar45;
  rar5 *prVar46;
  data_ready *pdVar47;
  uint8_t *puVar48;
  uint16_t num;
  uint16_t num_1;
  uint8_t bit_length [20];
  uint8_t table [430];
  ushort local_26a;
  rar5 *local_268;
  rar5 *local_260;
  uint8_t *local_258;
  uint8_t *local_250;
  archive_read *local_248;
  decode_table *local_240;
  wchar_t local_238;
  ushort local_232;
  decode_table *local_230;
  decode_table *local_228;
  uint local_21c;
  uint local_218 [6];
  ulong local_200;
  ulong local_1f8;
  decode_table *local_1f0;
  undefined1 local_1e8 [306];
  uint8_t local_b6 [64];
  uint8_t local_76 [16];
  uint8_t local_66 [54];
  
  rar = (rar5 *)a->format->data;
  if (size != (size_t *)0x0) {
    *size = 0;
  }
  bVar15 = (rar->file).field_0x20;
  if ((bVar15 & 8) != 0) {
    archive_set_error(&a->archive,0x54,"Can\'t decompress an entry marked as a directory");
    return L'\xffffffe7';
  }
  if ((rar->skip_mode == L'\0') && ((rar->file).unpacked_size < (rar->cstate).last_write_ptr)) {
    pcVar32 = "Unpacker has written too many bytes";
    goto LAB_006fb60e;
  }
  if ((rar->cstate).dready[0].used != '\0') {
    pdVar47 = (rar->cstate).dready;
LAB_006fb662:
    if (buff != (void **)0x0) {
      *buff = pdVar47->buf;
    }
    if (size != (size_t *)0x0) {
      *size = pdVar47->size;
    }
    if (offset != (int64_t *)0x0) {
      *offset = pdVar47->offset;
    }
    pdVar47->used = '\0';
    return L'\0';
  }
  if ((rar->cstate).dready[1].used != '\0') {
    pdVar47 = (rar->cstate).dready + 1;
    goto LAB_006fb662;
  }
  if ((bVar15 & 4) != 0) {
    return L'\x01';
  }
  if ((bVar15 & 2) == 0) {
    wVar18 = (rar->cstate).method;
    puVar48 = (uint8_t *)(ulong)(uint)wVar18;
    if (4 < (uint)(wVar18 + L'\xffffffff')) {
      if (wVar18 != L'\0') {
        pcVar32 = "Compression method not supported: 0x%x";
LAB_006fc5fe:
        archive_set_error(&a->archive,0x54,pcVar32,puVar48);
        return L'\xffffffe2';
      }
      goto LAB_006fc54e;
    }
    local_248 = a;
    if (offset != (int64_t *)0x0) {
      *offset = (rar->cstate).last_write_ptr;
    }
    do {
      prVar46 = (rar5 *)a->format->data;
      bVar15 = *(byte *)&prVar46->cstate;
      if ((bVar15 & 1) == 0) {
        puVar48 = (prVar46->cstate).window_buf;
        if (((ulong)prVar46->main & 1) == 0) {
LAB_006fb700:
          (prVar46->file).calculated_crc32 = 0;
          lVar28 = (prVar46->cstate).window_size;
          sVar20 = lVar28 - 1;
          if (lVar28 == 0) {
            sVar20 = 0;
          }
          (prVar46->cstate).window_mask = sVar20;
          free(puVar48);
          free((prVar46->cstate).filtered_buf);
          sVar33 = (prVar46->cstate).window_size;
          puVar48 = (uint8_t *)0x0;
          puVar21 = (uint8_t *)0x0;
          if (0 < (long)sVar33) {
            puVar48 = (uint8_t *)calloc(1,sVar33);
            puVar21 = (uint8_t *)calloc(1,sVar33);
          }
          (prVar46->cstate).window_buf = puVar48;
          (prVar46->cstate).filtered_buf = puVar21;
          (prVar46->cstate).write_ptr = 0;
          (prVar46->cstate).last_write_ptr = 0;
          memset(&(prVar46->cstate).bd,0,0x4a9c);
          bVar15 = *(byte *)&prVar46->cstate;
        }
        else if (puVar48 == (uint8_t *)0x0) {
          puVar48 = (uint8_t *)0x0;
          goto LAB_006fb700;
        }
        bVar15 = bVar15 | 1;
        *(byte *)&prVar46->cstate = bVar15;
      }
      if ((prVar46->cstate).window_size == 0) {
        pcVar32 = "Invalid window size declaration in this file";
LAB_006fc5e2:
        iVar19 = 0x54;
        goto LAB_006fb613;
      }
      prVar45 = prVar46;
      if ((bVar15 & 2) != 0) {
        do {
          local_268 = prVar45;
          prVar45 = (rar5 *)a->format->data;
          if (((((ulong)prVar45->main & 2) == 0) || ((prVar45->file).bytes_remaining != 0)) ||
             (wVar18 = advance_multivolume(a), wVar18 == L'\0')) {
            local_260 = prVar45;
            if ((undefined1  [19312])
                ((undefined1  [19312])prVar45->cstate & (undefined1  [19312])0x8) ==
                (undefined1  [19312])0x0) {
              puVar48 = (prVar45->cstate).block_buf;
            }
            else {
              local_1e8._0_8_ = 0xffffffffffffffff;
              pcVar22 = (compressed_block_header *)__archive_read_ahead(a,6,(ssize_t *)local_1e8);
              if (pcVar22 == (compressed_block_header *)0x0) {
                return L'\x01';
              }
              cVar7 = *pcVar22;
              prVar45->last_block_hdr = cVar7;
              bVar15 = cVar7.block_flags_u8 >> 3 & 7;
              puVar48 = (uint8_t *)(ulong)bVar15;
              if (2 < bVar15) {
                pcVar32 = "Unsupported block header size (was %d, max is 2)";
                goto LAB_006fc5fe;
              }
              if (bVar15 == 2) {
                puVar48 = (uint8_t *)(ulong)(*(uint *)(pcVar22 + 1) & 0xffffff);
              }
              else if (bVar15 == 1) {
                puVar48 = (uint8_t *)(ulong)(ushort)pcVar22[1];
              }
              else {
                puVar48 = (uint8_t *)(ulong)pcVar22[1].block_flags_u8;
              }
              if ((((uint)((ulong)puVar48 >> 0x10) ^ (uint)puVar48 ^
                   (uint)((ulong)puVar48 >> 8) ^ (uint)(byte)(cVar7.block_flags_u8 ^ 0x5a)) & 0xff)
                  != (uint)((ushort)cVar7 >> 8)) {
                archive_set_error(&a->archive,0x54,"Block checksum error: got 0x%x, expected 0x%x");
                return L'\xffffffe2';
              }
              uVar40 = (ulong)(byte)(bVar15 + 3);
              local_250 = puVar48;
              uVar36 = __archive_read_consume(a,uVar40);
              puVar21 = local_250;
              if (uVar36 != uVar40) {
                return L'\x01';
              }
              lVar28 = (prVar45->file).bytes_remaining - uVar40;
              (prVar45->file).bytes_remaining = lVar28;
              if (lVar28 < (long)local_250) {
                pvVar12 = a->format->data;
                if (*(int *)((long)pvVar12 + 0xc) != 0) {
                  pcVar32 = "Recursive merge is not allowed";
                  goto LAB_006fb60e;
                }
                *(byte *)((long)pvVar12 + 0x38) = *(byte *)((long)pvVar12 + 0x38) | 4;
                if (*(void **)((long)pvVar12 + 0x5320) != (void *)0x0) {
                  free(*(void **)((long)pvVar12 + 0x5320));
                }
                pvVar23 = malloc((size_t)(puVar21 + 8));
                *(void **)((long)pvVar12 + 0x5320) = pvVar23;
                if (pvVar23 == (void *)0x0) {
                  pcVar32 = "Can\'t allocate memory for a merge block buffer.";
                  goto LAB_006fc652;
                }
                puVar48 = (uint8_t *)((long)pvVar23 + (long)puVar21);
                puVar48[0] = '\0';
                puVar48[1] = '\0';
                puVar48[2] = '\0';
                puVar48[3] = '\0';
                puVar48[4] = '\0';
                puVar48[5] = '\0';
                puVar48[6] = '\0';
                puVar48[7] = '\0';
                puVar48 = *(uint8_t **)((long)pvVar12 + 0x4ba8);
                if ((long)puVar21 <= (long)*(uint8_t **)((long)pvVar12 + 0x4ba8)) {
                  puVar48 = puVar21;
                }
                if (puVar48 == (uint8_t *)0x0) {
LAB_006fc5b9:
                  pcVar32 = "Encountered block size == 0 during block merge";
                  a = local_248;
                  goto LAB_006fc5e2;
                }
                puVar41 = (uint8_t *)0x0;
                while( true ) {
                  local_1e8._0_8_ = 0xffffffffffffffff;
                  pvVar23 = __archive_read_ahead(local_248,(size_t)puVar48,(ssize_t *)local_1e8);
                  if (pvVar23 == (void *)0x0) {
                    return L'\x01';
                  }
                  puVar4 = puVar48 + (long)puVar41;
                  if ((long)puVar21 < (long)puVar4) {
                    pcVar32 = "Consumed too much data when merging blocks.";
                    a = local_248;
                    goto LAB_006fb60e;
                  }
                  memcpy(puVar41 + *(long *)((long)pvVar12 + 0x5320),pvVar23,(size_t)puVar48);
                  puVar41 = (uint8_t *)__archive_read_consume(local_248,(int64_t)puVar48);
                  a = local_248;
                  if (puVar41 != puVar48) {
                    return L'\x01';
                  }
                  puVar41 = *(uint8_t **)((long)pvVar12 + 0x4ba8);
                  puVar24 = puVar41 + -(long)puVar48;
                  *(uint8_t **)((long)pvVar12 + 0x4ba8) = puVar24;
                  puVar21 = puVar21 + -(long)puVar4;
                  if (puVar21 == (uint8_t *)0x0) break;
                  if (puVar41 == puVar48) {
                    *(int *)((long)pvVar12 + 0xc) = *(int *)((long)pvVar12 + 0xc) + 1;
                    wVar18 = advance_multivolume(local_248);
                    *(int *)((long)pvVar12 + 0xc) = *(int *)((long)pvVar12 + 0xc) + -1;
                    prVar46 = local_268;
                    if (wVar18 != L'\0') goto LAB_006fc50c;
                    puVar24 = *(uint8_t **)((long)pvVar12 + 0x4ba8);
                  }
                  puVar48 = puVar21;
                  if ((long)puVar24 < (long)puVar21) {
                    puVar48 = puVar24;
                  }
                  puVar41 = puVar4;
                  puVar21 = local_250;
                  if (puVar48 == (uint8_t *)0x0) goto LAB_006fc5b9;
                }
                puVar48 = *(uint8_t **)((long)pvVar12 + 0x5320);
                prVar45 = local_260;
                puVar21 = local_250;
              }
              else {
                *(byte *)&prVar45->cstate = *(byte *)&prVar45->cstate & 0xfb;
                local_1e8._0_8_ = 0xffffffffffffffff;
                puVar48 = (uint8_t *)
                          __archive_read_ahead(a,(size_t)(local_250 + 4),(ssize_t *)local_1e8);
                if (puVar48 == (uint8_t *)0x0) {
                  return L'\x01';
                }
              }
              (prVar45->cstate).block_buf = puVar48;
              (prVar45->cstate).cur_block_size = (ssize_t)puVar21;
              *(byte *)&prVar45->cstate = *(byte *)&prVar45->cstate & 0xf7;
              (prVar45->bits).in_addr = L'\0';
              (prVar45->bits).bit_addr = '\0';
              if ((char)(prVar45->last_block_hdr).block_flags_u8 < '\0') {
                iVar19 = 0;
                uVar31 = 0xf0;
                bVar15 = 4;
                wVar18 = L'\0';
                local_258 = puVar48;
                do {
                  if ((long)puVar21 <= (long)wVar18) {
                    iVar19 = 0x54;
                    pcVar32 = "Truncated data in huffman tables";
                    goto LAB_006fc4f6;
                  }
                  uVar30 = (local_258[wVar18] & uVar31) >> (bVar15 & 0x1f);
                  wVar18 = wVar18 + (uint)(uVar31 == 0xf);
                  lVar28 = (long)iVar19;
                  if (uVar30 == 0xf) {
                    uVar30 = (uVar31 ^ 0xff) & (uint)local_258[wVar18];
                    bVar5 = (bVar15 ^ 4) & 0x1f;
                    wVar18 = wVar18 + (uint)(uVar31 == 0xf0);
                    if (uVar30 >> bVar5 == 0) {
                      iVar19 = iVar19 + 1;
                      *(undefined1 *)((long)local_218 + lVar28) = 0xf;
                    }
                    else {
                      uVar37 = (uVar30 >> bVar5) + 1;
                      uVar30 = 0x13U - iVar19;
                      if (uVar37 < 0x13U - iVar19) {
                        uVar30 = uVar37;
                      }
                      local_240 = (decode_table *)CONCAT71(local_240._1_7_,bVar15);
                      memset((void *)((long)local_218 + lVar28),0,(ulong)(uVar30 + 1));
                      uVar36 = 0x13U - lVar28;
                      if ((ulong)uVar37 <= 0x13U - lVar28) {
                        uVar36 = (ulong)uVar37;
                      }
                      iVar19 = (int)uVar36 + iVar19 + 1;
                      bVar15 = (byte)local_240;
                    }
                  }
                  else {
                    iVar19 = iVar19 + 1;
                    *(char *)((long)local_218 + lVar28) = (char)uVar30;
                    uVar31 = uVar31 ^ 0xff;
                    bVar15 = bVar15 ^ 4;
                  }
                  puVar48 = local_258;
                  puVar21 = local_250;
                } while (iVar19 < 0x14);
                (local_260->bits).in_addr = wVar18;
                (local_260->bits).bit_addr = bVar15 ^ 4;
                pdVar34 = &(local_260->cstate).bd;
                create_decode_tables((uint8_t *)local_218,pdVar34,L'\x14');
                uVar31 = 0;
                do {
                  wVar18 = decode_number(a,pdVar34,puVar48,(uint16_t *)&local_238);
                  prVar45 = local_260;
                  if (wVar18 != L'\0') {
                    iVar19 = 0x54;
                    pcVar32 = "Decoding huffman tables failed";
                    goto LAB_006fc4f6;
                  }
                  uVar11 = (ushort)local_238;
                  if ((ushort)local_238 < 0x10) {
                    *(char *)((long)local_1e8 + (long)(int)uVar31) = (char)local_238;
                    uVar31 = uVar31 + 1;
                  }
                  else if ((ushort)local_238 < 0x12) {
                    wVar18 = read_bits_16(a,local_260,local_258,&local_26a);
                    prVar46 = local_268;
                    if (wVar18 != L'\0') goto LAB_006fc50c;
                    iVar19 = (int)(prVar45->bits).bit_addr + (uint)(uVar11 != 0x10) * 4 + 3;
                    pwVar2 = &(prVar45->bits).in_addr;
                    *pwVar2 = *pwVar2 + (iVar19 >> 3);
                    (prVar45->bits).bit_addr = (byte)iVar19 & 7;
                    if ((int)uVar31 < 1) {
                      iVar19 = 0x54;
                      pcVar32 = "Unexpected error when decoding huffman tables";
                      goto LAB_006fc4f6;
                    }
                    puVar48 = local_258;
                    prVar45 = local_260;
                    if (uVar31 < 0x1ae) {
                      uVar36 = (ulong)uVar31;
                      iVar19 = uVar31 - 1;
                      lVar28 = 0;
                      uVar30 = uVar31;
                      do {
                        *(undefined1 *)((long)local_1e8 + lVar28 + uVar36) =
                             *(undefined1 *)((long)local_1e8 + (ulong)(uint)(iVar19 + (int)lVar28));
                        uVar31 = uVar30 + 1;
                        if (0x1ac < (int)uVar30) break;
                        sVar39 = (short)lVar28;
                        lVar28 = lVar28 + 1;
                        uVar30 = uVar31;
                      } while ((ushort)((local_26a >> ((uVar11 == 0x10) << 2 | 9U)) +
                                        (ushort)(uVar11 != 0x10) * 8 + 2) != sVar39);
                    }
                  }
                  else {
                    wVar18 = read_bits_16(a,local_260,local_258,&local_26a);
                    prVar46 = local_268;
                    if (wVar18 != L'\0') goto LAB_006fc50c;
                    uVar30 = (uint)(uVar11 != 0x12);
                    iVar19 = (int)(prVar45->bits).bit_addr + uVar30 * 4 + 3;
                    pwVar2 = &(prVar45->bits).in_addr;
                    *pwVar2 = *pwVar2 + (iVar19 >> 3);
                    (prVar45->bits).bit_addr = (byte)iVar19 & 7;
                    uVar40 = (ulong)((uint)(local_26a >> ((uVar11 == 0x12) << 2 | 9U)) + uVar30 * 8
                                    + 2);
                    uVar36 = (ulong)(0x1ad - uVar31);
                    if (uVar40 <= 0x1ad - uVar31) {
                      uVar36 = uVar40;
                    }
                    memset((void *)((long)local_1e8 + (long)(int)uVar31),0,uVar36 + 1);
                    uVar36 = 0x1ad - (long)(int)uVar31;
                    if (uVar40 <= uVar36) {
                      uVar36 = uVar40;
                    }
                    uVar31 = uVar31 + (int)uVar36 + 1;
                    a = local_248;
                    puVar48 = local_258;
                  }
                } while ((int)uVar31 < 0x1ae);
                create_decode_tables(local_1e8,&(prVar45->cstate).ld,L'Ĳ');
                create_decode_tables(local_b6,&(prVar45->cstate).dd,L'@');
                create_decode_tables(local_76,&(prVar45->cstate).ldd,L'\x10');
                create_decode_tables(local_66,&(prVar45->cstate).rd,L',');
              }
            }
            prVar27 = (rar5 *)a->format->data;
            if ((prVar27->cstate).write_ptr - (prVar27->cstate).last_write_ptr <=
                (prVar27->cstate).window_size >> 1) {
              local_258 = (uint8_t *)(prVar27->cstate).window_mask;
              local_250 = (uint8_t *)
                          (CONCAT71(local_250._1_7_,(prVar27->last_block_hdr).block_flags_u8) &
                          0xffffffffffffff07);
              pdVar34 = &(prVar27->cstate).ld;
              local_230 = &(prVar27->cstate).rd;
              local_228 = &(prVar27->cstate).dd;
              local_1f0 = &(prVar27->cstate).ldd;
              local_240 = pdVar34;
LAB_006fbb55:
              lVar29 = (long)(prVar27->bits).in_addr;
              lVar28 = (prVar27->cstate).cur_block_size;
              if ((lVar28 <= lVar29) ||
                 ((lVar28 + -1 == lVar29 && ((char)local_250 < (prVar27->bits).bit_addr)))) {
                *(byte *)&prVar27->cstate = *(byte *)&prVar27->cstate | 8;
                goto LAB_006fc056;
              }
              wVar18 = decode_number(a,pdVar34,puVar48,&local_232);
              if (wVar18 != L'\0') {
                wVar18 = L'\x01';
                prVar46 = local_268;
                goto LAB_006fc50c;
              }
              if (local_232 < 0x100) {
                lVar28 = (prVar27->cstate).write_ptr;
                (prVar27->cstate).write_ptr = lVar28 + 1;
                (prVar27->cstate).window_buf
                [lVar28 + (prVar27->cstate).solid_offset & (ulong)local_258] = (uint8_t)local_232;
                goto LAB_006fc037;
              }
              uVar31 = (uint)local_232;
              if (uVar31 < 0x106) {
                if (local_232 == 0x101) {
                  wVar18 = (prVar27->cstate).last_len;
                  if ((wVar18 == L'\0') ||
                     (wVar18 = copy_string((archive_read *)a->format->data,wVar18,
                                           (prVar27->cstate).dist_cache[0]), wVar18 == L'\0'))
                  goto LAB_006fc037;
                  goto LAB_006fc4fd;
                }
                if (uVar31 == 0x100) {
                  rar_00 = (rar5 *)a->format->data;
                  wVar18 = parse_filter_data(a,rar_00,puVar48,(uint32_t *)local_1e8);
                  prVar46 = local_268;
                  if (((wVar18 != L'\0') ||
                      (wVar18 = parse_filter_data(a,rar_00,puVar48,local_218), prVar46 = local_268,
                      wVar18 != L'\0')) ||
                     (wVar18 = read_bits_16(a,rar_00,puVar48,&local_26a), prVar46 = local_268,
                     wVar18 != L'\0')) goto LAB_006fc50c;
                  iVar19 = (rar_00->bits).bit_addr + 3;
                  pwVar2 = &(rar_00->bits).in_addr;
                  *pwVar2 = *pwVar2 + (iVar19 >> 3);
                  (rar_00->bits).bit_addr = (byte)iVar19 & 7;
                  if ((0xffc00002 < local_218[0] - 0x400001) && (-1 < (short)local_26a)) {
                    lVar28 = (rar_00->cstate).last_block_start;
                    lVar29 = (rar_00->cstate).last_block_length;
                    if ((lVar29 == 0 || lVar28 == 0) ||
                       (lVar29 + lVar28 <=
                        (long)((rar_00->cstate).write_ptr + (local_1e8._0_8_ & 0xffffffff)))) {
                      local_21c = (uint)local_26a;
                      local_200 = local_1e8._0_8_ & 0xffffffff;
                      local_1f8 = (ulong)local_218[0];
                      puVar25 = (uint *)calloc(1,0x28);
                      if (puVar25 == (uint *)0x0) {
                        iVar19 = 0xc;
                        pcVar32 = "Can\'t allocate memory for a filter descriptor.";
                        goto LAB_006fc4f6;
                      }
                      uVar11 = (rar_00->cstate).filters.size;
                      uVar8 = (rar_00->cstate).filters.cap_mask;
                      if (uVar8 + 1 != (uint)uVar11) {
                        uVar9 = (rar_00->cstate).filters.end_pos;
                        (rar_00->cstate).filters.arr[uVar9] = (size_t)puVar25;
                        (rar_00->cstate).filters.end_pos = uVar8 & uVar9 + 1;
                        (rar_00->cstate).filters.size = uVar11 + 1;
                      }
                      *puVar25 = local_21c >> 0xd;
                      lVar28 = local_200 + (rar_00->cstate).write_ptr;
                      *(long *)(puVar25 + 4) = lVar28;
                      *(ulong *)(puVar25 + 6) = local_1f8;
                      (rar_00->cstate).last_block_start = lVar28;
                      (rar_00->cstate).last_block_length = local_1f8;
                      prVar45 = local_260;
                      pdVar34 = local_240;
                      if (0x1fff < (local_21c & 0xffff)) goto LAB_006fc037;
                      wVar18 = read_consume_bits(a,rar_00,puVar48,L'\x05',&local_238);
                      prVar46 = local_268;
                      if (wVar18 != L'\0') goto LAB_006fc50c;
                      puVar25[1] = local_238 + L'\x01';
                      prVar45 = local_260;
                      pdVar34 = local_240;
                      goto LAB_006fc037;
                    }
                  }
                  iVar19 = 0x54;
                  pcVar32 = "Invalid filter encountered";
                  goto LAB_006fc4f6;
                }
                wVar18 = (prVar27->cstate).dist_cache[uVar31 - 0x102];
                uVar36 = (ulong)(uVar31 - 0x102);
                if (0x102 < uVar31) {
                  do {
                    (prVar27->cstate).dist_cache[uVar36] = (prVar27->cstate).dist_cache[uVar36 - 1];
                    bVar14 = 1 < uVar36;
                    uVar36 = uVar36 - 1;
                  } while (bVar14);
                }
                (prVar27->cstate).dist_cache[0] = wVar18;
                wVar16 = decode_number(a,local_230,puVar48,(uint16_t *)local_1e8);
                if (wVar16 != L'\0') goto LAB_006fc4fd;
                wVar16 = decode_code_length(a,prVar27,puVar48,local_1e8._0_2_);
                if (wVar16 == L'\xffffffff') goto LAB_006fc4fd;
                (prVar27->cstate).last_len = wVar16;
                wVar18 = copy_string((archive_read *)a->format->data,wVar16,wVar18);
              }
              else {
                wVar16 = decode_code_length(a,prVar27,puVar48,local_232 - 0x106);
                if (wVar16 == L'\xffffffff') {
                  iVar19 = 0x16;
                  pcVar32 = "Failed to decode the code length";
                  goto LAB_006fc4f6;
                }
                wVar18 = decode_number(a,local_228,puVar48,(uint16_t *)local_218);
                if (wVar18 != L'\0') {
LAB_006fc470:
                  iVar19 = 0x16;
                  pcVar32 = "Failed to decode the distance slot";
                  goto LAB_006fc4f6;
                }
                if ((ushort)local_218[0] < 4) {
                  wVar18 = (local_218[0] & 0xffff) + L'\x01';
                }
                else {
                  uVar11 = (ushort)local_218[0] >> 1;
                  wVar18 = (uint)uVar11 + L'\xffffffff';
                  iVar19 = ((local_218[0] & 1 | 2) << ((byte)wVar18 & 0x1f)) + 1;
                  if ((uint)wVar18 < 4) {
                    wVar18 = read_consume_bits(a,prVar27,puVar48,wVar18,(wchar_t *)local_1e8);
                    prVar46 = local_268;
                    if (wVar18 != L'\0') goto LAB_006fc50c;
                    wVar18 = iVar19 + local_1e8._0_4_;
                  }
                  else {
                    if (wVar18 != L'\x04') {
                      wVar18 = (prVar27->bits).in_addr;
                      lVar28 = (long)wVar18;
                      if ((prVar27->cstate).cur_block_size <= lVar28) {
                        iVar19 = 0x16;
                        pcVar32 = "Premature end of stream during extraction of data (#1)";
LAB_006fc4f6:
                        archive_set_error(&a->archive,iVar19,pcVar32);
LAB_006fc4fd:
                        wVar18 = L'\xffffffe2';
                        prVar46 = local_268;
                        goto LAB_006fc50c;
                      }
                      uVar31 = *(uint *)(puVar48 + lVar28);
                      bVar15 = (prVar27->bits).bit_addr;
                      bVar5 = puVar48[lVar28 + 4];
                      iVar17 = (int)(char)bVar15 + (uint)uVar11 + -5;
                      (prVar27->bits).in_addr = (iVar17 >> 3) + wVar18;
                      (prVar27->bits).bit_addr = (byte)iVar17 & 7;
                      iVar19 = iVar19 + (((uint)(bVar5 >> (8 - bVar15 & 0x1f)) |
                                         (uVar31 >> 0x18 | (uVar31 & 0xff0000) >> 8 |
                                          (uVar31 & 0xff00) << 8 | uVar31 << 0x18) <<
                                         (bVar15 & 0x1f)) >> (0x25U - (char)uVar11 & 0x1f)) * 0x10;
                    }
                    wVar18 = decode_number(a,local_1f0,puVar48,(uint16_t *)local_1e8);
                    if (wVar18 != L'\0') goto LAB_006fc470;
                    if ((int)(0x7ffffffe - (uint)(ushort)local_1e8._0_2_) <= iVar19) {
                      iVar19 = 0x54;
                      pcVar32 = "Distance pointer overflow";
                      goto LAB_006fc4f6;
                    }
                    wVar18 = iVar19 + (uint)(ushort)local_1e8._0_2_;
                  }
                }
                if (L'Ā' < wVar18) {
                  if ((uint)wVar18 < 0x2001) {
                    wVar16 = wVar16 + L'\x01';
                  }
                  else {
                    wVar16 = (wVar16 - (uint)((uint)wVar18 < 0x40001)) + L'\x03';
                  }
                }
                (prVar27->cstate).dist_cache[3] = (prVar27->cstate).dist_cache[2];
                *(undefined8 *)((prVar27->cstate).dist_cache + 1) =
                     *(undefined8 *)(prVar27->cstate).dist_cache;
                (prVar27->cstate).dist_cache[0] = wVar18;
                (prVar27->cstate).last_len = wVar16;
                wVar18 = copy_string((archive_read *)a->format->data,wVar16,wVar18);
                prVar45 = local_260;
              }
              pdVar34 = local_240;
              if (wVar18 != L'\0') goto LAB_006fc4fd;
LAB_006fc037:
              if ((prVar27->cstate).window_size >> 1 <
                  (prVar27->cstate).write_ptr - (prVar27->cstate).last_write_ptr) goto LAB_006fc056;
              goto LAB_006fbb55;
            }
LAB_006fc056:
            prVar46 = local_268;
            bVar15 = *(byte *)&prVar45->cstate;
            if ((bVar15 & 0xc) == 8) {
              lVar28 = (prVar45->cstate).cur_block_size;
              if (0 < lVar28) {
                iVar26 = __archive_read_consume(a,lVar28);
                if (iVar26 != lVar28) {
                  return L'\xffffffe2';
                }
                (prVar45->file).bytes_remaining =
                     (prVar45->file).bytes_remaining - (prVar45->cstate).cur_block_size;
              }
            }
            else if ((bVar15 & 4) != 0) {
              *(byte *)&prVar45->cstate = bVar15 & 0xfb;
            }
          }
          else {
LAB_006fc50c:
            if ((wVar18 == L'\xffffffe2') || (wVar18 == L'\x01')) goto LAB_006fc53f;
          }
          prVar45 = local_268;
        } while ((prVar46->cstate).last_write_ptr == (prVar46->cstate).write_ptr);
      }
      prVar45 = (rar5 *)a->format->data;
      bVar15 = *(byte *)&prVar45->cstate;
      *(byte *)&prVar45->cstate = bVar15 & 0xfd;
      if ((prVar45->cstate).filters.size != 0) {
        puVar25 = (uint *)(prVar45->cstate).filters.arr[(prVar45->cstate).filters.beg_pos];
        lVar28 = (prVar45->cstate).write_ptr;
        lVar29 = *(long *)(puVar25 + 4);
        if ((lVar29 < lVar28) && (*(long *)(puVar25 + 6) + lVar29 <= lVar28)) {
          lVar28 = (prVar45->cstate).last_write_ptr;
          if (lVar28 != lVar29) {
            push_window_data(a,prVar45,lVar28,lVar29);
            goto LAB_006fc566;
          }
          prVar46 = (rar5 *)a->format->data;
          free((prVar46->cstate).filtered_buf);
          puVar21 = *(uint8_t **)(puVar25 + 6);
          prVar27 = (rar5 *)malloc((size_t)puVar21);
          (prVar46->cstate).filtered_buf = (uint8_t *)prVar27;
          a = local_248;
          if (prVar27 == (rar5 *)0x0) {
            pcVar32 = "Can\'t allocate memory for filter data.";
LAB_006fc652:
            iVar19 = 0xc;
            goto LAB_006fb613;
          }
          uVar31 = *puVar25;
          puVar48 = (uint8_t *)(ulong)uVar31;
          local_250 = puVar48;
          if (1 < uVar31 - 1) {
            if (uVar31 == 3) {
              puVar48 = (prVar46->cstate).window_buf;
              uVar36 = (prVar46->cstate).window_mask;
              uVar40 = *(long *)(puVar25 + 4) + (prVar46->cstate).solid_offset;
              puVar41 = (uint8_t *)(uVar40 & uVar36);
              local_250 = (uint8_t *)((ulong)(puVar21 + uVar40) & uVar36);
              if (local_250 < puVar41) {
                local_260 = prVar27;
                local_258 = puVar48;
                memcpy(prVar27,puVar41 + (long)puVar48,(uVar36 - (long)puVar41) + 1);
                prVar27 = (rar5 *)((long)local_260 + (uVar36 - (long)puVar41) + 1);
                puVar41 = local_250;
                puVar48 = local_258;
              }
              else {
                puVar48 = puVar48 + (long)puVar41;
                puVar41 = puVar21;
              }
              memcpy(prVar27,puVar48,(size_t)puVar41);
              if (3 < (long)puVar21) {
                uVar36 = 0;
                do {
                  prVar27 = (rar5 *)(prVar46->cstate).window_buf;
                  uVar40 = (prVar46->cstate).window_mask;
                  local_250 = *(uint8_t **)(puVar25 + 4);
                  if (*(uint8_t *)
                       ((long)&prVar27->header_initialized +
                       ((ulong)(local_250 + (prVar46->cstate).solid_offset + uVar36 + 3) & uVar40))
                      == 0xeb) {
                    uVar31 = (int)(local_250 + (prVar46->cstate).solid_offset) + (int)uVar36 &
                             (uint)uVar40;
                    uVar42 = (ulong)uVar31;
                    uVar31 = uVar31 + 4;
                    sVar33 = (size_t)((uint)uVar40 & uVar31);
                    if (sVar33 < uVar42) {
                      local_258 = (uint8_t *)(uVar40 - uVar42);
                      local_260 = prVar27;
                      memcpy(local_1e8,(uint8_t *)((long)&prVar27->header_initialized + uVar42),
                             (size_t)(local_258 + 1));
                      puVar48 = local_258 + (long)local_1e8 + 1;
                      prVar27 = local_260;
                    }
                    else {
                      prVar27 = (rar5 *)((long)&prVar27->header_initialized + uVar42);
                      sVar33 = uVar31 - uVar42;
                      puVar48 = local_1e8;
                    }
                    memcpy(puVar48,prVar27,sVar33);
                    puVar21 = local_250 + uVar36;
                    puVar48 = puVar21 + 3;
                    if (-1 < (long)puVar21) {
                      puVar48 = puVar21;
                    }
                    iVar19 = local_1e8._0_4_ - (int)((ulong)puVar48 >> 2);
                    puVar48 = (prVar46->cstate).filtered_buf;
                    uVar40 = uVar36 & 0xffffffff;
                    puVar48[uVar40] = (uint8_t)iVar19;
                    puVar48[uVar40 + 1] = (uint8_t)((uint)iVar19 >> 8);
                    puVar48[uVar40 + 2] = (uint8_t)((uint)iVar19 >> 0x10);
                    puVar48[uVar40 + 3] = 0xeb;
                    puVar21 = *(uint8_t **)(puVar25 + 6);
                  }
                  uVar36 = uVar36 + 4;
                } while ((long)uVar36 < (long)(puVar21 + -3));
              }
            }
            else {
              if (uVar31 != 0) {
                pcVar32 = "Unsupported filter type: 0x%x";
                goto LAB_006fc5fe;
              }
              uVar31 = puVar25[1];
              if (0 < (int)uVar31) {
                lVar28 = 0;
                lVar29 = 0;
                do {
                  if (lVar28 < (long)puVar21) {
                    uVar38 = '\0';
                    lVar43 = lVar28;
                    do {
                      uVar38 = uVar38 - (prVar46->cstate).window_buf
                                        [(prVar46->cstate).solid_offset + *(long *)(puVar25 + 4) +
                                         lVar29 & (prVar46->cstate).window_mask];
                      (prVar46->cstate).filtered_buf[lVar43] = uVar38;
                      lVar29 = lVar29 + 1;
                      uVar31 = puVar25[1];
                      lVar44 = (long)(int)uVar31;
                      lVar43 = lVar43 + lVar44;
                      puVar21 = *(uint8_t **)(puVar25 + 6);
                    } while (lVar43 < (long)puVar21);
                  }
                  else {
                    lVar44 = (long)(int)uVar31;
                  }
                  lVar28 = lVar28 + 1;
                } while (lVar28 < lVar44);
              }
            }
            goto LAB_006fca89;
          }
          pdVar34 = (decode_table *)(prVar46->cstate).window_buf;
          uVar36 = (prVar46->cstate).window_mask;
          uVar40 = *(long *)(puVar25 + 4) + (prVar46->cstate).solid_offset;
          puVar48 = (uint8_t *)(uVar40 & uVar36);
          local_258 = (uint8_t *)((ulong)(puVar21 + uVar40) & uVar36);
          if (local_258 < puVar48) {
            local_260 = prVar27;
            local_240 = pdVar34;
            memcpy(prVar27,puVar48 + (long)pdVar34,(uVar36 - (long)puVar48) + 1);
            prVar27 = (rar5 *)((long)local_260 + (uVar36 - (long)puVar48) + 1);
            puVar48 = local_258;
            pdVar34 = local_240;
          }
          else {
            pdVar34 = (decode_table *)(puVar48 + (long)(pdVar34->decode_len + -1));
            puVar48 = puVar21;
          }
          memcpy(prVar27,pdVar34,(size_t)puVar48);
          if ((long)puVar21 < 5) goto LAB_006fca89;
          pdVar34 = (decode_table *)0x0;
          goto LAB_006fc823;
        }
      }
      *(byte *)&prVar45->cstate = bVar15 | 2;
      if ((prVar46->cstate).filters.size == 0) {
        lVar28 = (prVar46->cstate).write_ptr;
      }
      else {
        lVar29 = *(long *)((prVar46->cstate).filters.arr[(prVar46->cstate).filters.beg_pos] + 0x10);
        lVar28 = (prVar46->cstate).write_ptr;
        if (lVar29 < lVar28) {
          lVar28 = lVar29;
        }
      }
      lVar29 = (prVar46->cstate).last_write_ptr;
      wVar18 = L'\xfffffff6';
      if (lVar28 != lVar29) {
        push_window_data(a,prVar46,lVar29,lVar28);
        (prVar46->cstate).last_write_ptr = lVar28;
        goto LAB_006fc566;
      }
LAB_006fc53f:
    } while (wVar18 == L'\xfffffff6');
  }
  else {
LAB_006fc54e:
    wVar18 = do_unstore_file(a,rar,buff,size,offset);
  }
  if (wVar18 != L'\0') {
    return wVar18;
  }
LAB_006fc566:
  wVar18 = L'\0';
  if (((rar->file).bytes_remaining == 0) &&
     (wVar18 = L'\0', (rar->cstate).last_write_ptr == (rar->file).unpacked_size)) {
    puVar3 = &(rar->file).field_0x20;
    *puVar3 = *puVar3 | 4;
    wVar18 = verify_global_checksums(a);
  }
  return wVar18;
LAB_006fc823:
  do {
    pdVar13 = (decode_table *)(prVar46->cstate).window_buf;
    uVar36 = (prVar46->cstate).window_mask;
    lVar28 = (prVar46->cstate).solid_offset + *(long *)(puVar25 + 4);
    pdVar35 = (decode_table *)((long)&pdVar34->size + 1);
    cVar6 = *(char *)((long)pdVar13->decode_len +
                     (((long)pdVar34->decode_len + lVar28 + -4 & uVar36) - 4));
    if ((cVar6 == -0x18) || ((int)local_250 == 2 && cVar6 == -0x17)) {
      local_260 = (rar5 *)((long)pdVar35->decode_len + *(long *)(puVar25 + 4) + -4);
      iVar19 = (int)local_260 + 0xffffff;
      if (-1 < (long)local_260) {
        iVar19 = (int)local_260;
      }
      local_258 = (uint8_t *)CONCAT44(local_258._4_4_,iVar19);
      uVar31 = (int)lVar28 + (int)pdVar35 & (uint)uVar36;
      prVar27 = (rar5 *)(ulong)uVar31;
      uVar31 = uVar31 + 4;
      local_268 = (rar5 *)(ulong)((uint)uVar36 & uVar31);
      local_240 = pdVar35;
      if (local_268 < prVar27) {
        local_230 = (decode_table *)(uVar36 - (long)prVar27);
        local_228 = pdVar13;
        memcpy(local_1e8,(void *)((long)pdVar13->decode_len + (long)&prVar27[-1].field_0x532c),
               (size_t)((long)&local_230->size + 1));
        __dest = (undefined8 *)((long)local_230->decode_len + (long)&local_1f0 + 5);
        prVar27 = local_268;
        pdVar35 = local_228;
      }
      else {
        pdVar35 = (decode_table *)
                  ((long)((decode_table *)(pdVar13->decode_len + -1))->decode_len +
                  (long)&prVar27[-1].field_0x532c);
        prVar27 = (rar5 *)((ulong)uVar31 - (long)prVar27);
        __dest = (undefined8 *)local_1e8;
      }
      memcpy(__dest,pdVar35,(size_t)prVar27);
      iVar19 = (int)local_260 - ((uint)local_258 & 0xff000000);
      if ((int)local_1e8._0_4_ < L'\0') {
        if (-1 < iVar19 + local_1e8._0_4_) {
          wVar18 = local_1e8._0_4_ + L'\x01000000';
          wVar16 = local_1e8._0_4_;
          goto LAB_006fc928;
        }
      }
      else if ((uint)local_1e8._0_4_ < 0x1000000) {
        wVar18 = local_1e8._0_4_ - iVar19;
        wVar16 = wVar18;
LAB_006fc928:
        puVar48 = (prVar46->cstate).filtered_buf;
        uVar36 = (ulong)local_240 & 0xffffffff;
        puVar48[uVar36] = (uint8_t)wVar16;
        puVar48[uVar36 + 1] = (uint8_t)((uint)wVar16 >> 8);
        puVar48[uVar36 + 2] = (uint8_t)((uint)wVar16 >> 0x10);
        puVar48[uVar36 + 3] = (uint8_t)((uint)wVar18 >> 0x18);
        puVar21 = *(uint8_t **)(puVar25 + 6);
      }
      pdVar35 = (decode_table *)((long)pdVar34->decode_len + 1);
    }
    pdVar34 = pdVar35;
  } while ((long)pdVar35 < (long)(puVar21 + -4));
LAB_006fca89:
  wVar18 = push_data_ready(local_248,prVar46,(prVar46->cstate).filtered_buf,(size_t)puVar21,
                           (prVar46->cstate).last_write_ptr);
  if (wVar18 != L'\0') {
    pcVar32 = "Stack overflow when submitting unpacked data";
    a = local_248;
LAB_006fb60e:
    iVar19 = 0x16;
LAB_006fb613:
    archive_set_error(&a->archive,iVar19,pcVar32);
    return L'\xffffffe2';
  }
  piVar1 = &(prVar46->cstate).last_write_ptr;
  *piVar1 = *piVar1 + *(long *)(puVar25 + 6);
  uVar10 = (prVar45->cstate).filters.size;
  if (uVar10 != 0) {
    uVar11 = (prVar45->cstate).filters.beg_pos;
    puVar25 = (uint *)(prVar45->cstate).filters.arr[uVar11];
    (prVar45->cstate).filters.beg_pos = uVar11 + 1 & (prVar45->cstate).filters.cap_mask;
    (prVar45->cstate).filters.size = uVar10 - 1;
  }
  free(puVar25);
  a = local_248;
  goto LAB_006fc566;
}

Assistant:

static int rar5_read_data(struct archive_read *a, const void **buff,
    size_t *size, int64_t *offset) {
	int ret;
	struct rar5* rar = get_context(a);

	if (size)
		*size = 0;

	if(rar->file.dir > 0) {
		/* Don't process any data if this file entry was declared
		 * as a directory. This is needed, because entries marked as
		 * directory doesn't have any dictionary buffer allocated, so
		 * it's impossible to perform any decompression. */
		archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
		    "Can't decompress an entry marked as a directory");
		return ARCHIVE_FAILED;
	}

	if(!rar->skip_mode && (rar->cstate.last_write_ptr > rar->file.unpacked_size)) {
		archive_set_error(&a->archive, ARCHIVE_ERRNO_PROGRAMMER,
		    "Unpacker has written too many bytes");
		return ARCHIVE_FATAL;
	}

	ret = use_data(rar, buff, size, offset);
	if(ret == ARCHIVE_OK) {
		return ret;
	}

	if(rar->file.eof == 1) {
		return ARCHIVE_EOF;
	}

	ret = do_unpack(a, rar, buff, size, offset);
	if(ret != ARCHIVE_OK) {
		return ret;
	}

	if(rar->file.bytes_remaining == 0 &&
			rar->cstate.last_write_ptr == rar->file.unpacked_size)
	{
		/* If all bytes of current file were processed, run
		 * finalization.
		 *
		 * Finalization will check checksum against proper values. If
		 * some of the checksums will not match, we'll return an error
		 * value in the last `archive_read_data` call to signal an error
		 * to the user. */

		rar->file.eof = 1;
		return verify_global_checksums(a);
	}

	return ARCHIVE_OK;
}